

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O1

void __thiscall
httplib::Server::apply_ranges
          (Server *this,Request *req,Response *res,string *content_type,string *boundary)

{
  Headers *this_00;
  string *this_01;
  size_t length_00;
  pointer ppVar1;
  pointer ppVar2;
  detail *pdVar3;
  anon_class_16_2_20c26d81 content;
  char cVar4;
  EncodingType EVar5;
  iterator __position;
  _Alloc_hider _Var6;
  ulong uVar7;
  char *val;
  long lVar8;
  detail *pdVar9;
  char cVar10;
  string *content_length;
  pointer pcVar11;
  ulong uVar12;
  size_t offset;
  bool bVar13;
  string length;
  _Alloc_hider in_stack_ffffffffffffff68;
  _Alloc_hider __first;
  uint local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  undefined8 local_58;
  
  content_length = boundary;
  local_58 = content_type;
  if (0x10 < (ulong)((long)(req->ranges).
                           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(req->ranges).
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    detail::make_multipart_data_boundary_abi_cxx11_();
    std::__cxx11::string::operator=((string *)boundary,(string *)&stack0xffffffffffffff68);
    if (in_stack_ffffffffffffff68._M_p != &stack0xffffffffffffff78) {
      operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
    }
    in_stack_ffffffffffffff68._M_p = &stack0xffffffffffffff78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffff68,"Content-Type","");
    this_00 = &res->headers;
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&this_00->_M_t,(key_type *)&stack0xffffffffffffff68);
    if (in_stack_ffffffffffffff68._M_p != &stack0xffffffffffffff78) {
      operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
    }
    if ((_Rb_tree_header *)__position._M_node != &(res->headers)._M_t._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::string::_M_assign((string *)local_58);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&this_00->_M_t,(const_iterator)__position._M_node);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,"multipart/byteranges; boundary=",boundary);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[13],std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [13])"Content-Type",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff68);
    if (in_stack_ffffffffffffff68._M_p != &stack0xffffffffffffff78) {
      operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
    }
  }
  EVar5 = detail::encoding_type(req,res);
  length_00 = (res->body)._M_string_length;
  if (length_00 == 0) {
    _Var6._M_p = (pointer)res->content_length_;
    if (_Var6._M_p == (pointer)0x0) {
      if ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      if (res->is_chunked_content_provider_ != true) {
        return;
      }
      local_78._M_allocated_capacity = 0x1375a3;
      cVar10 = 'T';
      bVar13 = true;
      lVar8 = 1;
      do {
        if ((cVar10 == '\n') || (cVar10 == '\r')) break;
        cVar10 = "Transfer-Encoding"[lVar8];
        bVar13 = cVar10 != '\0';
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x12);
      if (!bVar13) {
        cVar10 = 'c';
        bVar13 = true;
        lVar8 = 1;
        do {
          if ((cVar10 == '\n') || (cVar10 == '\r')) break;
          cVar10 = "chunked"[lVar8];
          bVar13 = cVar10 != '\0';
          lVar8 = lVar8 + 1;
        } while (lVar8 != 8);
        if (!bVar13) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_emplace_equal<char_const*&,char_const*&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&res->headers,(char **)&stack0xffffffffffffff68,
                     (char **)&local_78._M_allocated_capacity);
        }
      }
      if (EVar5 == Brotli) {
        val = "br";
      }
      else {
        if (EVar5 != Gzip) {
          return;
        }
        val = "gzip";
      }
      Response::set_header(res,"Content-Encoding",val);
      return;
    }
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 != ppVar2) {
      if ((long)ppVar2 - (long)ppVar1 == 0x10) {
        pdVar3 = (detail *)ppVar1->first;
        pcVar11 = (pointer)ppVar1->second;
        if (((ulong)pdVar3 & (ulong)pcVar11) == 0xffffffffffffffff) {
          pdVar9 = (detail *)0x0;
          pcVar11 = _Var6._M_p;
        }
        else {
          pdVar9 = (detail *)0x0;
          if (0 < (long)(_Var6._M_p + -(long)pcVar11)) {
            pdVar9 = (detail *)(_Var6._M_p + -(long)pcVar11);
          }
          if (pdVar3 != (detail *)0xffffffffffffffff) {
            pdVar9 = pdVar3;
          }
          if (pdVar3 == (detail *)0xffffffffffffffff) {
            pcVar11 = _Var6._M_p + -1;
          }
          if (pcVar11 == (pointer)0xffffffffffffffff) {
            pcVar11 = _Var6._M_p + -1;
          }
          pcVar11 = pcVar11 + (1 - (long)pdVar9);
        }
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)&stack0xffffffffffffff68,pdVar9,(size_t)pcVar11,(size_t)_Var6._M_p,
                   (size_t)content_length);
        local_78._M_allocated_capacity = 0x137583;
        cVar10 = 'C';
        bVar13 = true;
        lVar8 = 1;
        do {
          if ((cVar10 == '\n') || (cVar10 == '\r')) break;
          cVar10 = "Content-Range"[lVar8];
          bVar13 = cVar10 != '\0';
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        if (!bVar13) {
          cVar10 = *in_stack_ffffffffffffff68._M_p;
          _Var6._M_p = in_stack_ffffffffffffff68._M_p;
          while (((cVar10 != '\0' && (_Var6._M_p = _Var6._M_p + 1, cVar10 != '\n')) &&
                 (cVar10 != '\r'))) {
            cVar10 = *_Var6._M_p;
          }
          if (cVar10 == '\0') {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&res->headers,(char **)&local_78._M_allocated_capacity,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff68);
          }
        }
        _Var6._M_p = pcVar11;
        if (in_stack_ffffffffffffff68._M_p != &stack0xffffffffffffff78) {
          operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
        }
      }
      else {
        _Var6._M_p = (pointer)0x0;
        detail::
        process_multipart_ranges_data<httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(char_const*)_1_,httplib::detail::get_multipart_ranges_data_length(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(unsigned_long,unsigned_long)_1_>
                  (req,res,boundary,(string *)local_58,
                   (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff68,
                   (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff68,
                   (anon_class_8_1_b58d1f7b)&stack0xffffffffffffff68);
      }
    }
    cVar10 = '\x01';
    if ((pointer)0x9 < _Var6._M_p) {
      pcVar11 = _Var6._M_p;
      cVar4 = '\x04';
      do {
        cVar10 = cVar4;
        if (pcVar11 < (pointer)0x64) {
          cVar10 = cVar10 + -2;
          goto LAB_0011ab8d;
        }
        if (pcVar11 < (pointer)0x3e8) {
          cVar10 = cVar10 + -1;
          goto LAB_0011ab8d;
        }
        if (pcVar11 < (pointer)0x2710) goto LAB_0011ab8d;
        bVar13 = (pointer)0x1869f < pcVar11;
        pcVar11 = (pointer)((ulong)pcVar11 / 10000);
        cVar4 = cVar10 + '\x04';
      } while (bVar13);
      cVar10 = cVar10 + '\x01';
    }
LAB_0011ab8d:
    __first._M_p = &stack0xffffffffffffff78;
    std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff68,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (__first._M_p,local_90,(unsigned_long)_Var6._M_p);
    local_78._M_allocated_capacity = 0x13752a;
    cVar10 = 'C';
    bVar13 = true;
    lVar8 = 1;
    do {
      if ((cVar10 == '\n') || (cVar10 == '\r')) break;
      cVar10 = "Content-Length"[lVar8];
      bVar13 = cVar10 != '\0';
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xf);
    if (!bVar13) {
      cVar10 = *__first._M_p;
      _Var6._M_p = __first._M_p;
      while (((cVar10 != '\0' && (_Var6._M_p = _Var6._M_p + 1, cVar10 != '\n')) && (cVar10 != '\r'))
            ) {
        cVar10 = *_Var6._M_p;
      }
      if (cVar10 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,(char **)&local_78._M_allocated_capacity,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68);
      }
    }
  }
  else {
    ppVar1 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (req->ranges).
             super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (ppVar1 != ppVar2) {
      this_01 = &res->body;
      if ((long)ppVar2 - (long)ppVar1 == 0x10) {
        pdVar3 = (detail *)ppVar1->first;
        uVar12 = ppVar1->second;
        if (((ulong)pdVar3 & uVar12) == 0xffffffffffffffff) {
          pdVar9 = (detail *)0x0;
          offset = length_00;
        }
        else {
          pdVar9 = (detail *)0x0;
          if (0 < (long)(length_00 - uVar12)) {
            pdVar9 = (detail *)(length_00 - uVar12);
          }
          if (pdVar3 != (detail *)0xffffffffffffffff) {
            pdVar9 = pdVar3;
          }
          if (pdVar3 == (detail *)0xffffffffffffffff) {
            uVar12 = length_00 - 1;
          }
          if (uVar12 == 0xffffffffffffffff) {
            uVar12 = length_00 - 1;
          }
          offset = (uVar12 - (long)pdVar9) + 1;
        }
        detail::make_content_range_header_field_abi_cxx11_
                  ((string *)&stack0xffffffffffffff68,pdVar9,offset,length_00,(size_t)content_length
                  );
        local_78._M_allocated_capacity = 0x137583;
        cVar10 = 'C';
        bVar13 = true;
        lVar8 = 1;
        do {
          if ((cVar10 == '\n') || (cVar10 == '\r')) break;
          cVar10 = "Content-Range"[lVar8];
          bVar13 = cVar10 != '\0';
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0xe);
        if (!bVar13) {
          cVar10 = *in_stack_ffffffffffffff68._M_p;
          _Var6._M_p = in_stack_ffffffffffffff68._M_p;
          while (((cVar10 != '\0' && (_Var6._M_p = _Var6._M_p + 1, cVar10 != '\n')) &&
                 (cVar10 != '\r'))) {
            cVar10 = *_Var6._M_p;
          }
          if (cVar10 == '\0') {
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&res->headers,(char **)&local_78._M_allocated_capacity,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff68);
          }
        }
        if (pdVar9 < (detail *)(res->body)._M_string_length) {
          std::__cxx11::string::substr((ulong)&local_78,(ulong)this_01);
          std::__cxx11::string::operator=((string *)this_01,(string *)local_78._M_local_buf);
          if ((Response *)local_78._M_allocated_capacity != (Response *)&stack0xffffffffffffff98) {
            operator_delete((void *)local_78._M_allocated_capacity,(ulong)(local_68._M_p + 1));
          }
        }
        else {
          (res->body)._M_string_length = 0;
          *(res->body)._M_dataplus._M_p = '\0';
          res->status = 0x1a0;
        }
        if (in_stack_ffffffffffffff68._M_p != &stack0xffffffffffffff78) {
          operator_delete(in_stack_ffffffffffffff68._M_p,CONCAT71(uStack_87,local_88) + 1);
        }
      }
      else {
        local_90 = 0;
        local_88 = '\0';
        local_78._8_8_ = &stack0xffffffffffffff68;
        content.data = (string *)&stack0xffffffffffffff78;
        content.res = (Response *)local_78._8_8_;
        _Var6._M_p = (pointer)&stack0xffffffffffffff78;
        local_78._M_allocated_capacity = (size_type)res;
        bVar13 = detail::
                 process_multipart_ranges_data<httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(std::__cxx11::string_const&)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(char_const*)_1_,httplib::detail::make_multipart_ranges_data(httplib::Request_const&,httplib::Response&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&)::_lambda(unsigned_long,unsigned_long)_1_>
                           ((detail *)req,(Request *)res,(Response *)boundary,(string *)local_58,
                            (string *)local_78._8_8_,(anon_class_8_1_898a9ca8)local_78._8_8_,
                            (anon_class_8_1_898a9ca8)res,content);
        if (bVar13) {
          std::__cxx11::string::swap((string *)this_01);
        }
        else {
          (res->body)._M_string_length = 0;
          *(res->body)._M_dataplus._M_p = '\0';
          res->status = 0x1a0;
        }
        if ((string *)_Var6._M_p != (string *)&stack0xffffffffffffff78) {
          operator_delete(_Var6._M_p,CONCAT71(uStack_87,local_88) + 1);
        }
      }
    }
    uVar12 = (res->body)._M_string_length;
    cVar10 = '\x01';
    if (9 < uVar12) {
      uVar7 = uVar12;
      cVar4 = '\x04';
      do {
        cVar10 = cVar4;
        if (uVar7 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_0011a975;
        }
        if (uVar7 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_0011a975;
        }
        if (uVar7 < 10000) goto LAB_0011a975;
        bVar13 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        cVar4 = cVar10 + '\x04';
      } while (bVar13);
      cVar10 = cVar10 + '\x01';
    }
LAB_0011a975:
    __first._M_p = &stack0xffffffffffffff78;
    std::__cxx11::string::_M_construct((ulong)&stack0xffffffffffffff68,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>(__first._M_p,local_90,uVar12);
    local_78._M_allocated_capacity = 0x13752a;
    cVar10 = 'C';
    bVar13 = true;
    lVar8 = 1;
    do {
      if ((cVar10 == '\n') || (cVar10 == '\r')) break;
      cVar10 = "Content-Length"[lVar8];
      bVar13 = cVar10 != '\0';
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xf);
    if (!bVar13) {
      cVar10 = *__first._M_p;
      _Var6._M_p = __first._M_p;
      while (((cVar10 != '\0' && (_Var6._M_p = _Var6._M_p + 1, cVar10 != '\n')) && (cVar10 != '\r'))
            ) {
        cVar10 = *_Var6._M_p;
      }
      if (cVar10 == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const*&,std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&res->headers,(char **)&local_78._M_allocated_capacity,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68);
      }
    }
  }
  if (__first._M_p != &stack0xffffffffffffff78) {
    operator_delete(__first._M_p,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

inline void Server::apply_ranges(const Request& req, Response& res,
        std::string& content_type,
        std::string& boundary) {
        if (req.ranges.size() > 1) {
            boundary = detail::make_multipart_data_boundary();

            auto it = res.headers.find("Content-Type");
            if (it != res.headers.end()) {
                content_type = it->second;
                res.headers.erase(it);
            }

            res.headers.emplace("Content-Type",
                "multipart/byteranges; boundary=" + boundary);
        }

        auto type = detail::encoding_type(req, res);

        if (res.body.empty()) {
            if (res.content_length_ > 0) {
                size_t length = 0;
                if (req.ranges.empty()) {
                    length = res.content_length_;
                }
                else if (req.ranges.size() == 1) {
                    auto offsets =
                        detail::get_range_offset_and_length(req, res.content_length_, 0);
                    auto offset = offsets.first;
                    length = offsets.second;
                    auto content_range = detail::make_content_range_header_field(
                        offset, length, res.content_length_);
                    res.set_header("Content-Range", content_range);
                }
                else {
                    length = detail::get_multipart_ranges_data_length(req, res, boundary,
                        content_type);
                }
                res.set_header("Content-Length", std::to_string(length));
            }
            else {
                if (res.content_provider_) {
                    if (res.is_chunked_content_provider_) {
                        res.set_header("Transfer-Encoding", "chunked");
                        if (type == detail::EncodingType::Gzip) {
                            res.set_header("Content-Encoding", "gzip");
                        }
                        else if (type == detail::EncodingType::Brotli) {
                            res.set_header("Content-Encoding", "br");
                        }
                    }
                }
            }
        }
        else {
            if (req.ranges.empty()) {
                ;
            }
            else if (req.ranges.size() == 1) {
                auto offsets =
                    detail::get_range_offset_and_length(req, res.body.size(), 0);
                auto offset = offsets.first;
                auto length = offsets.second;
                auto content_range = detail::make_content_range_header_field(
                    offset, length, res.body.size());
                res.set_header("Content-Range", content_range);
                if (offset < res.body.size()) {
                    res.body = res.body.substr(offset, length);
                }
                else {
                    res.body.clear();
                    res.status = 416;
                }
            }
            else {
                std::string data;
                if (detail::make_multipart_ranges_data(req, res, boundary, content_type,
                    data)) {
                    res.body.swap(data);
                }
                else {
                    res.body.clear();
                    res.status = 416;
                }
            }

            if (type != detail::EncodingType::None) {
                std::unique_ptr<detail::compressor> compressor;
                std::string content_encoding;

                if (type == detail::EncodingType::Gzip) {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
                    compressor = detail::make_unique<detail::gzip_compressor>();
                    content_encoding = "gzip";
#endif
                }
                else if (type == detail::EncodingType::Brotli) {
#ifdef CPPHTTPLIB_BROTLI_SUPPORT
                    compressor = detail::make_unique<detail::brotli_compressor>();
                    content_encoding = "br";
#endif
                }

                if (compressor) {
                    std::string compressed;
                    if (compressor->compress(res.body.data(), res.body.size(), true,
                        [&](const char* data, size_t data_len) {
                            compressed.append(data, data_len);
                            return true;
                        })) {
                        res.body.swap(compressed);
                        res.set_header("Content-Encoding", content_encoding);
                    }
                }
            }

            auto length = std::to_string(res.body.size());
            res.set_header("Content-Length", length);
        }
    }